

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O3

void Kit_PlaToTruth(char *pSop,int nVars,Vec_Ptr_t *vVars,uint *pTemp,uint *pTruth)

{
  ulong uVar1;
  char cVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  
  if (pSop == (char *)0x0) {
    __assert_fail("pSop != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitPla.c"
                  ,499,
                  "void Kit_PlaToTruth(char *, int, Vec_Ptr_t *, unsigned int *, unsigned int *)");
  }
  if (nVars < 0) {
    __assert_fail("nVars >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitPla.c"
                  ,500,
                  "void Kit_PlaToTruth(char *, int, Vec_Ptr_t *, unsigned int *, unsigned int *)");
  }
  sVar6 = strlen(pSop);
  uVar8 = (ulong)(nVars + 3);
  if (sVar6 % uVar8 != 0) {
    puts("Kit_PlaToTruth(): SOP is represented incorrectly.");
    return;
  }
  uVar4 = 1 << ((char)nVars - 5U & 0x1f);
  if ((uint)nVars < 6) {
    uVar4 = 1;
  }
  uVar11 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    memset(pTruth,0,uVar11 * 4);
  }
  sVar6 = strlen(pSop);
  iVar10 = 0;
  iVar5 = (int)(sVar6 / uVar8);
  if (0 < iVar5) {
    uVar1 = uVar11 + 1;
    do {
      cVar2 = pSop[(ulong)(uint)nVars + 1];
      if (0 < (int)uVar4) {
        memset(pTemp,0xff,uVar11 * 4);
      }
      if (nVars != 0) {
        uVar7 = 0;
        do {
          if (pSop[uVar7] == '0') {
            if ((long)vVars->nSize <= (long)uVar7) {
LAB_00561f04:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            if (0 < (int)uVar4) {
              pvVar3 = vVars->pArray[uVar7];
              uVar9 = uVar1;
              do {
                pTemp[uVar9 - 2] = pTemp[uVar9 - 2] & ~*(uint *)((long)pvVar3 + uVar9 * 4 + -8);
                uVar9 = uVar9 - 1;
              } while (1 < uVar9);
            }
          }
          else if (pSop[uVar7] == '1') {
            if ((long)vVars->nSize <= (long)uVar7) goto LAB_00561f04;
            if (0 < (int)uVar4) {
              pvVar3 = vVars->pArray[uVar7];
              uVar9 = uVar1;
              do {
                pTemp[uVar9 - 2] = pTemp[uVar9 - 2] & *(uint *)((long)pvVar3 + uVar9 * 4 + -8);
                uVar9 = uVar9 - 1;
              } while (1 < uVar9);
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != nVars + (uint)(nVars == 0));
      }
      uVar7 = uVar1;
      if (0 < (int)uVar4) {
        do {
          pTruth[uVar7 - 2] = pTruth[uVar7 - 2] | pTemp[uVar7 - 2];
          uVar7 = uVar7 - 1;
        } while (1 < uVar7);
      }
      pSop = pSop + uVar8;
      iVar10 = iVar10 + 1;
    } while (iVar10 < iVar5);
    if ((0 < (int)uVar4) && (cVar2 == '0')) {
      uVar11 = uVar11 + 1;
      do {
        pTruth[uVar11 - 2] = ~pTruth[uVar11 - 2];
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
    }
  }
  return;
}

Assistant:

void Kit_PlaToTruth( char * pSop, int nVars, Vec_Ptr_t * vVars, unsigned * pTemp, unsigned * pTruth )
{
    int v, c, nCubes, fCompl = 0;
    assert( pSop != NULL );
    assert( nVars >= 0 );
    if ( strlen(pSop) % (nVars + 3) != 0 )
    {
        printf( "Kit_PlaToTruth(): SOP is represented incorrectly.\n" );
        return;
    }
    // iterate through the cubes
    Kit_TruthClear( pTruth, nVars );
    nCubes =  strlen(pSop) / (nVars + 3);
    for ( c = 0; c < nCubes; c++ )
    {
        fCompl = (pSop[nVars+1] == '0');
        Kit_TruthFill( pTemp, nVars );
        // iterate through the literals of the cube
        for ( v = 0; v < nVars; v++ )
            if ( pSop[v] == '1' )
                Kit_TruthAnd( pTemp, pTemp, (unsigned *)Vec_PtrEntry(vVars, v), nVars );
            else if ( pSop[v] == '0' )
                Kit_TruthSharp( pTemp, pTemp, (unsigned *)Vec_PtrEntry(vVars, v), nVars );
        // add cube to storage
        Kit_TruthOr( pTruth, pTruth, pTemp, nVars );
        // go to the next cube
        pSop += (nVars + 3);
    }
    if ( fCompl )
        Kit_TruthNot( pTruth, pTruth, nVars );
}